

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cpp
# Opt level: O2

void __thiscall Simulator::memoryAccess(Simulator *this)

{
  uint32_t *puVar1;
  uint uVar2;
  uint64_t val;
  uint64_t uVar3;
  byte bVar4;
  uint16_t uVar5;
  uint32_t uVar6;
  ulong uVar7;
  uint32_t uVar8;
  char *format;
  InstSet IVar9;
  ulong uVar10;
  uint32_t addr;
  ulong uVar11;
  uint32_t cycles;
  uint32_t local_40;
  uint32_t local_3c;
  ulong local_38;
  
  uVar2 = (this->m_reg).super_ClockReg<Simulator::MRegX>.out.opcode;
  uVar6 = (this->m_reg).super_ClockReg<Simulator::MRegX>.out.func;
  uVar11 = (this->m_reg).super_ClockReg<Simulator::MRegX>.out.valE;
  val = (this->m_reg).super_ClockReg<Simulator::MRegX>.out.val2;
  uVar8 = (this->m_reg).super_ClockReg<Simulator::MRegX>.out.rd;
  uVar3 = (this->m_reg).super_ClockReg<Simulator::MRegX>.out.pc;
  IVar9 = (this->m_reg).super_ClockReg<Simulator::MRegX>.out.inst;
  if (this->is_verbose == true) {
    local_3c = uVar8;
    local_38 = (ulong)IVar9;
    printf("\tMA: %s ",*(undefined8 *)(RISCV_GRX::INSTNAME + (ulong)IVar9 * 8),uVar3);
    IVar9 = (InstSet)local_38;
    uVar8 = local_3c;
  }
  local_40 = 0;
  uVar7 = 0;
  if (0x3b < uVar2) {
LAB_00108f1b:
    if ((0x10 < uVar2 - 99) || ((0x11011U >> (uVar2 - 99 & 0x1f) & 1) == 0)) {
      raiseError(this,"Invaild Instruction at %x\n",uVar3);
    }
    goto LAB_0010903c;
  }
  uVar10 = (ulong)uVar2;
  if ((0x888000008880001U >> (uVar10 & 0x3f) & 1) != 0) goto LAB_0010903c;
  addr = (uint32_t)uVar11;
  if (uVar10 == 3) {
    puVar1 = &(this->history).load_count;
    *puVar1 = *puVar1 + 1;
    switch(uVar6) {
    case 0:
    case 4:
      bVar4 = MemoryManager::getByte(this->memory,addr,&local_40);
      uVar7 = (ulong)bVar4;
      break;
    case 1:
      uVar5 = MemoryManager::getShort(this->memory,addr,&local_40);
      uVar7 = (ulong)uVar5;
      break;
    case 2:
    case 5:
      uVar6 = MemoryManager::getInt(this->memory,addr,&local_40);
      uVar7 = (ulong)uVar6;
      break;
    case 3:
      uVar7 = MemoryManager::getLong(this->memory,addr,&local_40);
      break;
    case 6:
      uVar6 = MemoryManager::getInt(this->memory,addr,&local_40);
      uVar11 = (ulong)uVar6;
      goto LAB_00109034;
    default:
      format = "Invaild LOAD Instruction at %x, The Func Field %x is invaild\n";
LAB_0010908c:
      raiseError(this,format,uVar3);
    }
  }
  else {
    if (uVar10 != 0x23) goto LAB_00108f1b;
    puVar1 = &(this->history).store_count;
    *puVar1 = *puVar1 + 1;
    switch(uVar6) {
    case 0:
      MemoryManager::setByte(this->memory,addr,(uint8_t)val,&local_40);
      break;
    case 1:
      MemoryManager::setShort(this->memory,addr,(uint16_t)val,&local_40);
      break;
    case 2:
      MemoryManager::setInt(this->memory,addr,(uint32_t)val,&local_40);
      break;
    case 3:
      MemoryManager::setLong(this->memory,addr,val,&local_40);
      break;
    default:
      format = "Invaild READ Instruction at %x, The Func Field %x is invaild\n";
      goto LAB_0010908c;
    }
LAB_00109034:
    uVar7 = 0;
  }
LAB_0010903c:
  puVar1 = &(this->history).cycle_count;
  *puVar1 = *puVar1 + local_40;
  (this->w_reg).super_ClockReg<Simulator::WRegX>.in.opcode = uVar2;
  (this->w_reg).super_ClockReg<Simulator::WRegX>.in.rd = uVar8;
  (this->w_reg).super_ClockReg<Simulator::WRegX>.in.valE = uVar11;
  (this->w_reg).super_ClockReg<Simulator::WRegX>.in.valM = uVar7;
  (this->w_reg).super_ClockReg<Simulator::WRegX>.in.inst = IVar9;
  (this->bypass).m_valM = uVar7;
  return;
}

Assistant:

void Simulator::memoryAccess() {
    uint32_t opcode = m_reg.out.opcode;
    uint32_t func = m_reg.out.func;
    int64_t valE = m_reg.out.valE;
    int64_t val2 = m_reg.out.val2;
    uint32_t rd = m_reg.out.rd;
    uint64_t pc = m_reg.out.pc;
    InstSet inst = m_reg.out.inst;
    if (is_verbose) {
        printf("\tMA: %s ", INSTNAME[inst]);
    }
    int64_t valM = 0;
    uint32_t cycles = 0;

    switch (opcode) {
        case OP_LOAD: {
            history.load_count++;
            switch (func) {
                case 0x0:
                    valM = (int64_t) memory->getByte(valE, &cycles);
                    break;
                case 0x1:
                    valM = (int64_t) memory->getShort(valE, &cycles);
                    break;
                case 0x2:
                    valM = (int64_t) memory->getInt(valE, &cycles);
                    break;
                case 0x3:
                    valM = (int64_t) memory->getLong(valE, &cycles);
                    break;
                case 0x4:
                    valM = (uint64_t) memory->getByte(valE, &cycles);
                    break;
                case 0x5:
                    valM = (uint64_t) memory->getInt(valE, &cycles);
                    break;
                case 0x6:
                    valE = (uint64_t) memory->getInt(valE, &cycles);
                    break;
                default:
                    this->raiseError("Invaild LOAD Instruction at %x, The Func Field %x is invaild\n", pc, func);
                    break;
            }
//            cycles = 100;
            break;
        }
        case OP_STORE:
            history.store_count++;
            switch (func) {
                case 0x0:
                    memory->setByte(valE, val2, &cycles);
                    break;
                case 0x1:
                    memory->setShort(valE, val2, &cycles);
                    break;
                case 0x2:
                    memory->setInt(valE, val2, &cycles);
                    break;
                case 0x3:
                    memory->setLong(valE, val2, &cycles);
                    break;
                default:
                    this->raiseError("Invaild READ Instruction at %x, The Func Field %x is invaild\n", pc, func);
                    break;
            }
//            cycles = 100;
            break;

        case OP_RR:
        case OP_32:
        case OP_IMM:
        case OP_IMM_32:
        case OP_BRANCH:
        case OP_JAL:
        case OP_JALR:
        case OP_LUI:
        case OP_AUIPC:
        case OP_ECALL:

        case OP_BUBBLE:
            break;
        default:
            this->raiseError("Invaild Instruction at %x\n", pc);
            break;
    }

    this->history.cycle_count += cycles;

    w_reg.in.opcode = opcode;
    w_reg.in.rd = rd;
    w_reg.in.valE = valE;
    w_reg.in.valM = valM;
    w_reg.in.inst = inst;

    bypass.m_valM = valM;

}